

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O1

void get_gym_info(header_t *h,long length,track_info_t *out)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (*(int *)h->tag == 0x584d5947) {
    lVar1 = (length * 0x32) / 3;
    if (*(uint *)h->loop_start == 0) {
      out->length = lVar1;
      out->intro_length = lVar1;
      lVar1 = 0;
    }
    else {
      uVar2 = ((ulong)*(uint *)h->loop_start * 0x32) / 3;
      out->intro_length = uVar2;
      lVar1 = lVar1 - uVar2;
    }
    out->loop_length = lVar1;
    if (*(long *)(h->song + 5) != 0x676e6f53206e77 || *(long *)h->song != 0x206e776f6e6b6e55) {
      Gme_File::copy_field_(out->song,h->song,0x20);
    }
    if (*(long *)(h->game + 5) != 0x656d6147206e77 || *(long *)h->game != 0x206e776f6e6b6e55) {
      Gme_File::copy_field_(out->game,h->game,0x20);
    }
    auVar3[0] = -(h->copyright[0] == 'U');
    auVar3[1] = -(h->copyright[1] == 'n');
    auVar3[2] = -(h->copyright[2] == 'k');
    auVar3[3] = -(h->copyright[3] == 'n');
    auVar3[4] = -(h->copyright[4] == 'o');
    auVar3[5] = -(h->copyright[5] == 'w');
    auVar3[6] = -(h->copyright[6] == 'n');
    auVar3[7] = -(h->copyright[7] == ' ');
    auVar3[8] = -(h->copyright[8] == 'P');
    auVar3[9] = -(h->copyright[9] == 'u');
    auVar3[10] = -(h->copyright[10] == 'b');
    auVar3[0xb] = -(h->copyright[0xb] == 'l');
    auVar3[0xc] = -(h->copyright[0xc] == 'i');
    auVar3[0xd] = -(h->copyright[0xd] == 's');
    auVar3[0xe] = -(h->copyright[0xe] == 'h');
    auVar3[0xf] = -(h->copyright[0xf] == 'e');
    auVar5[0] = -((char)*(undefined2 *)(h->copyright + 0x10) == 'r');
    auVar5[1] = -((char)((ushort)*(undefined2 *)(h->copyright + 0x10) >> 8) == '\0');
    auVar5[2] = 0xff;
    auVar5[3] = 0xff;
    auVar5[4] = 0xff;
    auVar5[5] = 0xff;
    auVar5[6] = 0xff;
    auVar5[7] = 0xff;
    auVar5[8] = 0xff;
    auVar5[9] = 0xff;
    auVar5[10] = 0xff;
    auVar5[0xb] = 0xff;
    auVar5[0xc] = 0xff;
    auVar5[0xd] = 0xff;
    auVar5[0xe] = 0xff;
    auVar5[0xf] = 0xff;
    auVar5 = auVar5 & auVar3;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff) {
      Gme_File::copy_field_(out->copyright,h->copyright,0x20);
    }
    if (*(long *)(h->dumper + 7) != 0x6e6f7372655020 || *(long *)h->dumper != 0x206e776f6e6b6e55) {
      Gme_File::copy_field_(out->dumper,h->dumper,0x20);
    }
    auVar6[0] = -(h->comment[6] == ' ');
    auVar6[1] = -(h->comment[7] == 'a');
    auVar6[2] = -(h->comment[8] == 'd');
    auVar6[3] = -(h->comment[9] == 'd');
    auVar6[4] = -(h->comment[10] == 'e');
    auVar6[5] = -(h->comment[0xb] == 'd');
    auVar6[6] = -(h->comment[0xc] == ' ');
    auVar6[7] = -(h->comment[0xd] == 'b');
    auVar6[8] = -(h->comment[0xe] == 'y');
    auVar6[9] = -(h->comment[0xf] == ' ');
    auVar6[10] = -(h->comment[0x10] == 'Y');
    auVar6[0xb] = -(h->comment[0x11] == 'M');
    auVar6[0xc] = -(h->comment[0x12] == 'A');
    auVar6[0xd] = -(h->comment[0x13] == 'M');
    auVar6[0xe] = -(h->comment[0x14] == 'P');
    auVar6[0xf] = -(h->comment[0x15] == '\0');
    auVar4[0] = -(h->comment[0] == 'H');
    auVar4[1] = -(h->comment[1] == 'e');
    auVar4[2] = -(h->comment[2] == 'a');
    auVar4[3] = -(h->comment[3] == 'd');
    auVar4[4] = -(h->comment[4] == 'e');
    auVar4[5] = -(h->comment[5] == 'r');
    auVar4[6] = -(h->comment[6] == ' ');
    auVar4[7] = -(h->comment[7] == 'a');
    auVar4[8] = -(h->comment[8] == 'd');
    auVar4[9] = -(h->comment[9] == 'd');
    auVar4[10] = -(h->comment[10] == 'e');
    auVar4[0xb] = -(h->comment[0xb] == 'd');
    auVar4[0xc] = -(h->comment[0xc] == ' ');
    auVar4[0xd] = -(h->comment[0xd] == 'b');
    auVar4[0xe] = -(h->comment[0xe] == 'y');
    auVar4[0xf] = -(h->comment[0xf] == ' ');
    auVar4 = auVar4 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) {
      Gme_File::copy_field_(out->comment,h->comment,0x100);
      return;
    }
  }
  return;
}

Assistant:

static void get_gym_info( Gym_Emu::header_t const& h, long length, track_info_t* out )
{
	if ( !memcmp( h.tag, "GYMX", 4 ) )
	{
		length = length * 50 / 3; // 1000 / 60
		long loop = get_le32( h.loop_start );
		if ( loop )
		{
			out->intro_length = loop * 50 / 3;
			out->loop_length  = length - out->intro_length;
		}
		else
		{
			out->length = length;
			out->intro_length = length; // make it clear that track is no longer than length
			out->loop_length = 0;
		}
		
		// more stupidity where the field should have been left
		if ( strcmp( h.song, "Unknown Song" ) )
			GME_COPY_FIELD( h, out, song );
		
		if ( strcmp( h.game, "Unknown Game" ) )
			GME_COPY_FIELD( h, out, game );
		
		if ( strcmp( h.copyright, "Unknown Publisher" ) )
			GME_COPY_FIELD( h, out, copyright );
		
		if ( strcmp( h.dumper, "Unknown Person" ) )
			GME_COPY_FIELD( h, out, dumper );
		
		if ( strcmp( h.comment, "Header added by YMAMP" ) )
			GME_COPY_FIELD( h, out, comment );
	}
}